

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionError.h
# Opt level: O1

PositionError * __thiscall
KDIS::DATA_TYPE::PositionError::operator=(PositionError *this,PositionError *param_1)

{
  DataTypeBase local_60;
  short local_58;
  KFIXED<short,_(unsigned_char)__b_> local_50;
  DataTypeBase local_40;
  short local_38;
  KFIXED<short,_(unsigned_char)__b_> local_30;
  
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222d88;
  local_38 = (param_1->m_HorzErr).m_Val;
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_30,&this->m_HorzErr);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_40);
  local_60._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222d88;
  local_58 = (param_1->m_VertErr).m_Val;
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_50,&this->m_VertErr);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60);
  return this;
}

Assistant:

class KDIS_EXPORT PositionError : public DataTypeBase
{
protected:

    KFIXED16_8 m_HorzErr;

    KFIXED16_8 m_VertErr;

public:

    static const KUINT16 POSITION_ERROR_SIZE = 4;

    PositionError();

    PositionError( KFIXED16_8 Horizontal, KFIXED16_8 Vertical );

    PositionError(KDataStream &stream) noexcept(false);

    virtual ~PositionError();

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::SetHorizontalError
    //              KDIS::DATA_TYPE::PositionError::GetHorizontalError
    // Description: The error components that are associated with the
    //              location measurement  for an entity. These errors
    //              are measured in entity-centered tangent planes.
    // Parameter:   KFIXED16_8 HE
    //************************************
    void SetHorizontalError( KFIXED16_8 HE );
    KFIXED16_8 GetHorizontalError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::SetVerticalError
    //              KDIS::DATA_TYPE::PositionError::GetVerticalError
    // Description: The error components that are associated with the
    //              location measurement  for an entity. These errors
    //              are measured in entity-centered tangent planes.
    // Parameter:   KFIXED16_8 VE
    //************************************
    void SetVerticalError( KFIXED16_8 VE );
    KFIXED16_8 GetVerticalError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DataTypeBase::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const PositionError & Value ) const;
    KBOOL operator != ( const PositionError & Value ) const;
}